

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Boundary_matrix.h
# Opt level: O2

void __thiscall
Gudhi::persistence_matrix::
Boundary_matrix<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true>_>_>
::Boundary_matrix(Boundary_matrix<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true>_>_>
                  *this,Column_settings *colSettings)

{
  Matrix_all_dimension_holder<int>::Matrix_all_dimension_holder
            (&this->super_Matrix_dimension_option,-1);
  (this->
  super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options<false,_(Column_types)7,_false,_true,_true>_>_>_>
  ).rowToIndex_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->
  super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options<false,_(Column_types)7,_false,_true,_true>_>_>_>
  ).rowToIndex_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->
  super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options<false,_(Column_types)7,_false,_true,_true>_>_>_>
  ).indexToRow_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->
  super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options<false,_(Column_types)7,_false,_true,_true>_>_>_>
  ).rowToIndex_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->
  super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options<false,_(Column_types)7,_false,_true,_true>_>_>_>
  ).indexToRow_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->
  super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options<false,_(Column_types)7,_false,_true,_true>_>_>_>
  ).indexToRow_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->
  super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options<false,_(Column_types)7,_false,_true,_true>_>_>_>
  ).rowSwapped_ = false;
  Base_pairing<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true>_>_>
  ::Base_pairing(&this->super_Base_pairing_option);
  *(undefined8 *)
   ((long)&(this->matrix_).
           super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined8 *)
   ((long)&(this->matrix_).
           super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 4) = 0;
  (this->matrix_).
  super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->matrix_).
  super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  this->colSettings_ = colSettings;
  return;
}

Assistant:

inline Boundary_matrix<Master_matrix>::Boundary_matrix(Column_settings* colSettings)
    : Dim_opt(Master_matrix::template get_null_value<Dimension>()),
      Swap_opt(),
      Pair_opt(),
      RA_opt(),
      nextInsertIndex_(0),
      colSettings_(colSettings)
{}